

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

void __thiscall CInput::StopTextInput(CInput *this)

{
  SDL_StopTextInput();
  SDL_EventState(0x201,0);
  this->m_CompositionLength = -1;
  this->m_CompositionCursor = 0;
  this->m_CompositionSelectedLength = 0;
  this->m_aComposition[0] = '\0';
  this->m_CandidateCount = 0;
  return;
}

Assistant:

void CInput::StopTextInput()
{
	SDL_StopTextInput();
	// disable system messages for performance
	SDL_EventState(SDL_SYSWMEVENT, SDL_DISABLE);
	m_CompositionLength = COMP_LENGTH_INACTIVE;
	m_CompositionCursor = 0;
	m_aComposition[0] = 0;
	m_CompositionSelectedLength = 0;
	m_CandidateCount = 0;
}